

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatBase
          (ParsedFormatBase *this,string_view format,bool allow_ignored,
          initializer_list<absl::lts_20250127::FormatConversionCharSet> convs)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ParsedFormatConsumer consumer;
  
  if (format._M_len == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)operator_new__(format._M_len);
  }
  (this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = pcVar3;
  (this->items_).
  super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->items_).
  super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->items_).
  super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  consumer.data_pos = pcVar3;
  consumer.parsed = this;
  bVar1 = ParseFormatString<absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatConsumer>
                    (format,consumer);
  bVar2 = true;
  if (bVar1) {
    bVar2 = MatchesConversions(this,allow_ignored,convs);
    bVar2 = !bVar2;
  }
  this->has_error_ = bVar2;
  return;
}

Assistant:

ParsedFormatBase::ParsedFormatBase(
    string_view format, bool allow_ignored,
    std::initializer_list<FormatConversionCharSet> convs)
    : data_(format.empty() ? nullptr : new char[format.size()]) {
  has_error_ = !ParseFormatString(format, ParsedFormatConsumer(this)) ||
               !MatchesConversions(allow_ignored, convs);
}